

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCom.c
# Opt level: O1

void If_Init(Abc_Frame_t *pAbc)

{
  If_LibLut_t *pLib;
  If_LibLut_t s_LutLib;
  If_LibLut_t IStack_11a8;
  
  memcpy(&IStack_11a8,&PTR_anon_var_dwarf_393808_00bb4f20,0x1198);
  pLib = If_LibLutDup(&IStack_11a8);
  Abc_FrameSetLibLut(pLib);
  Cmd_CommandAdd(pAbc,"FPGA mapping","read_lut",If_CommandReadLut,0);
  Cmd_CommandAdd(pAbc,"FPGA mapping","print_lut",If_CommandPrintLut,0);
  Cmd_CommandAdd(pAbc,"FPGA mapping","read_box",If_CommandReadBox,0);
  Cmd_CommandAdd(pAbc,"FPGA mapping","print_box",If_CommandPrintBox,0);
  return;
}

Assistant:

void If_Init( Abc_Frame_t * pAbc )
{
    // set the default library
    If_LibLut_t s_LutLib = { "lutlib", 4, 0, {0,1,1,1,1}, {{0},{1},{1},{1},{1}} };
    Abc_FrameSetLibLut( If_LibLutDup(&s_LutLib) );

    Cmd_CommandAdd( pAbc, "FPGA mapping", "read_lut",   If_CommandReadLut,   0 ); 
    Cmd_CommandAdd( pAbc, "FPGA mapping", "print_lut",  If_CommandPrintLut,  0 ); 

    Cmd_CommandAdd( pAbc, "FPGA mapping", "read_box",   If_CommandReadBox,   0 ); 
    Cmd_CommandAdd( pAbc, "FPGA mapping", "print_box",  If_CommandPrintBox,  0 ); 
}